

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_parse.c
# Opt level: O2

MPP_RET avs2_add_nalu_header(Avs2dCtx_t *p_dec,RK_U32 header)

{
  uint uVar1;
  MPP_RET extraout_EAX;
  Avs2dNalu_t *pAVar2;
  
  if (p_dec->nal_allocated < p_dec->nal_cnt + 1) {
    pAVar2 = (Avs2dNalu_t *)
             mpp_osal_realloc("avs2_add_nalu_header",p_dec->p_nals,
                              (ulong)(p_dec->nal_allocated + 0x14) << 4);
    if (pAVar2 == (Avs2dNalu_t *)0x0) {
      _mpp_log_l(2,"avs2d_parse","Realloc NALU buffer failed, could not add more NALU!",
                 "avs2_add_nalu_header");
    }
    else {
      p_dec->p_nals = pAVar2;
      memset(pAVar2 + p_dec->nal_allocated,0,0x140);
      p_dec->nal_allocated = p_dec->nal_allocated + 0x14;
      if (((byte)avs2d_parse_debug & 8) != 0) {
        _mpp_log_l(4,"avs2d_parse","Realloc NALU buffer, current allocated %d",
                   "avs2_add_nalu_header");
      }
    }
  }
  pAVar2 = p_dec->p_nals;
  uVar1 = p_dec->nal_cnt;
  pAVar2[uVar1].header = header;
  pAVar2[uVar1].length = 0;
  pAVar2[uVar1].data_pos = 0;
  pAVar2[uVar1].eof = '\0';
  p_dec->nal_cnt = uVar1 + 1;
  if (((byte)avs2d_parse_debug & 8) == 0) {
    return 0x302e30;
  }
  _mpp_log_l(4,"avs2d_parse","add header 0x%x, nal_cnt %d","avs2_add_nalu_header",header);
  return extraout_EAX;
}

Assistant:

static MPP_RET avs2_add_nalu_header(Avs2dCtx_t *p_dec, RK_U32 header)
{
    MPP_RET ret = MPP_OK;
    Avs2dNalu_t *p_nal = NULL;

    if (p_dec->nal_cnt + 1 > p_dec->nal_allocated) {
        Avs2dNalu_t *new_buffer = mpp_realloc(p_dec->p_nals, Avs2dNalu_t, p_dec->nal_allocated + MAX_NALU_NUM);

        if (!new_buffer) {
            mpp_err_f("Realloc NALU buffer failed, could not add more NALU!");
            ret = MPP_ERR_NOMEM;
        } else {
            p_dec->p_nals = new_buffer;
            memset(&p_dec->p_nals[p_dec->nal_allocated], 0, MAX_NALU_NUM * sizeof(Avs2dNalu_t));
            p_dec->nal_allocated += MAX_NALU_NUM;
            AVS2D_PARSE_TRACE("Realloc NALU buffer, current allocated %d", p_dec->nal_allocated);
        }
    }

    p_nal = p_dec->p_nals + p_dec->nal_cnt;
    p_nal->header = header;
    p_nal->length = 0;
    p_nal->data_pos = 0;
    p_nal->eof = 0;

    p_dec->nal_cnt++;
    AVS2D_PARSE_TRACE("add header 0x%x, nal_cnt %d", header, p_dec->nal_cnt);

    return ret;
}